

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  PathPtr fromPath_00;
  PathPtr path;
  PathPtr toPath_00;
  PathPtr toPath_01;
  int fromDirFd;
  undefined8 uVar1;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  TransferMode *pTVar5;
  PathPtr PVar6;
  StringPtr toPath_02;
  StringPtr fromPath_01;
  int error;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  TransferMode local_a4;
  PathPtr local_a0;
  int local_8c;
  DebugComparison<kj::TransferMode_&,_kj::TransferMode> local_88;
  String local_58;
  Function<int_(kj::StringPtr)> local_40;
  
  local_a0.parts.size_ = toPath.parts.size_;
  local_a0.parts.ptr = toPath.parts.ptr;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_88.op.content.ptr = " > ";
  local_88.op.content.size_ = 4;
  local_88.result = (TransferMode *)local_a0.parts.size_ != (TransferMode *)0x0;
  local_a4 = mode;
  local_88.left = (TransferMode *)local_a0.parts.size_;
  if ((TransferMode *)local_a0.parts.size_ == (TransferMode *)0x0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[19]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x58e,FAILED,"toPath.size() > 0","_kjCondition,\"can\'t replace self\"",
               (DebugComparison<unsigned_long,_int> *)&local_88,(char (*) [19])"can\'t replace self"
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_58);
    return false;
  }
  if (mode == MOVE) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&local_88,fromDirectory);
    if ((char)local_88.left != '\0') {
      fromDirFd = local_88.left._4_4_;
      local_88.left = &local_a4;
      local_88.result = local_a4 == MOVE;
      local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
      local_88.op.content.ptr = " == ";
      local_88.op.content.size_ = 5;
      if (!local_88.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::TransferMode&,kj::TransferMode>&>
                  ((Fault *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x599,FAILED,"mode == TransferMode::MOVE","_kjCondition,",&local_88);
        kj::_::Debug::Fault::fatal((Fault *)&local_58);
      }
      local_8c = 0;
      PathPtr::toString((String *)&local_88,&local_a0,false);
      uVar1 = local_88._8_8_;
      pTVar5 = local_88.left;
      PathPtr::toString(&local_58,&fromPath,false);
      toPath_02.content.size_ = uVar1 + (ulong)(uVar1 == 0);
      if (uVar1 == 0) {
        pTVar5 = (TransferMode *)0x524569;
      }
      pcVar4 = "";
      if (local_58.content.size_ != 0) {
        pcVar4 = local_58.content.ptr;
      }
      fromPath_01.content.size_ = local_58.content.size_ + (local_58.content.size_ == 0);
      toPath_02.content.ptr = (char *)pTVar5;
      fromPath_01.content.ptr = pcVar4;
      bVar3 = tryCommitReplacement(this,toPath_02,fromDirFd,fromPath_01,toMode,&local_8c);
      sVar2 = local_58.content.size_;
      pcVar4 = local_58.content.ptr;
      if (local_58.content.ptr != (char *)0x0) {
        local_58.content.ptr = (char *)0x0;
        local_58.content.size_ = 0;
        (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                  (local_58.content.disposer,pcVar4,1,sVar2,sVar2,0);
      }
      uVar1 = local_88._8_8_;
      pTVar5 = local_88.left;
      if (local_88.left != (TransferMode *)0x0) {
        local_88.left = (TransferMode *)0x0;
        local_88._8_8_ = 0;
        (*(code *)**(undefined8 **)local_88.op.content.ptr)
                  (local_88.op.content.ptr,pTVar5,1,uVar1,uVar1,0);
      }
      if (bVar3) {
        return true;
      }
      if (local_8c != 0) {
        if (local_8c == 0x12) goto LAB_004d21bf;
        if (local_8c == 2) {
          if ((~toMode & 5) != 0) {
            return false;
          }
          if ((TransferMode *)local_a0.parts.size_ == (TransferMode *)0x0) {
            return false;
          }
          PVar6 = PathPtr::parent(&local_a0);
          bVar3 = tryMkdir(this,PVar6,CREATE_PARENT|MODIFY|CREATE,true);
          if (bVar3) {
            toPath_00.parts.size_ = local_a0.parts.size_;
            toPath_00.parts.ptr = local_a0.parts.ptr;
            PVar6.parts.size_ = fromPath.parts.size_;
            PVar6.parts.ptr = fromPath.parts.ptr;
            bVar3 = tryTransfer(this,toPath_00,toMode & ~CREATE_PARENT,fromDirectory,PVar6,local_a4,
                                self);
            return bVar3;
          }
        }
        else {
          kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                    ((Fault *)&local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x5b5,local_8c,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                     &local_a0);
          kj::_::Debug::Fault::~Fault((Fault *)&local_88);
        }
      }
      return false;
    }
  }
  else if (mode == LINK) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&local_58,fromDirectory);
    local_88.left = (TransferMode *)CONCAT71(local_88.left._1_7_,(char)local_58.content.ptr);
    if ((char)local_58.content.ptr == '\x01') {
      local_88.left = (TransferMode *)CONCAT44(local_58.content.ptr._4_4_,local_88.left._0_4_);
      path.parts.size_ = local_a0.parts.size_;
      path.parts.ptr = local_a0.parts.ptr;
      local_40.impl.ptr = (Iface *)operator_new(0x20);
      (local_40.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006e4c80;
      local_40.impl.ptr[1]._vptr_Iface = (_func_int **)((long)&local_88.left + 4);
      local_40.impl.ptr[2]._vptr_Iface = (_func_int **)&fromPath;
      local_40.impl.ptr[3]._vptr_Iface = (_func_int **)this;
      local_40.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      bVar3 = tryReplaceNode(this,path,toMode,&local_40);
      if (local_40.impl.ptr == (Iface *)0x0) {
        return bVar3;
      }
      (**(local_40.impl.disposer)->_vptr_Disposer)
                (local_40.impl.disposer,
                 (local_40.impl.ptr)->_vptr_Iface[-2] + (long)&(local_40.impl.ptr)->_vptr_Iface);
      return bVar3;
    }
  }
LAB_004d21bf:
  toPath_01.parts.size_ = local_a0.parts.size_;
  toPath_01.parts.ptr = local_a0.parts.ptr;
  fromPath_00.parts.size_ = fromPath.parts.size_;
  fromPath_00.parts.ptr = fromPath.parts.ptr;
  bVar3 = Directory::tryTransfer(self,toPath_01,toMode,fromDirectory,fromPath_00,local_a4);
  return bVar3;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }